

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnEndExpr(BinaryReaderInterp *this)

{
  pointer *ppLVar1;
  LabelType LVar2;
  Istream *this_00;
  Result RVar3;
  Label *pLVar4;
  Enum EVar5;
  Label *label;
  
  RVar3 = TypeChecker::GetLabel(&(this->validator_).typechecker_,0,&label);
  EVar5 = Error;
  if (RVar3.enum_ != Error) {
    LVar2 = label->label_type;
    RVar3 = SharedValidator::OnEnd
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc)
    ;
    if (RVar3.enum_ != Error) {
      if (LVar2 - If < 2) {
        this_00 = this->istream_;
        pLVar4 = TopLabel(this);
        Istream::ResolveFixupU32(this_00,pLVar4->fixup_offset);
      }
      FixupTopLabel(this);
      ppLVar1 = &(this->label_stack_).
                 super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + -1;
      EVar5 = Ok;
    }
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderInterp::OnEndExpr() {
  SharedValidator::Label* label;
  CHECK_RESULT(validator_.GetLabel(0, &label));
  LabelType label_type = label->label_type;
  CHECK_RESULT(validator_.OnEnd(loc));
  if (label_type == LabelType::If || label_type == LabelType::Else) {
    istream_.ResolveFixupU32(TopLabel()->fixup_offset);
  }
  FixupTopLabel();
  PopLabel();
  return Result::Ok;
}